

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O0

bool __thiscall
hash_map<int,_Timer::IdState>::is_key_exist(hash_map<int,_Timer::IdState> *this,int *key)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_int,_Timer::IdState>,_false> local_48 [3];
  _Node_iterator_base<std::pair<const_int,_Timer::IdState>,_false> local_30;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lck;
  int *key_local;
  hash_map<int,_Timer::IdState> *this_local;
  
  lck._8_8_ = key;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->hm_mutex);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_Timer::IdState,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Timer::IdState>_>_>
       ::find(&this->hm_map,(key_type *)lck._8_8_);
  local_48[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_Timer::IdState,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Timer::IdState>_>_>
       ::end(&this->hm_map);
  bVar1 = std::__detail::operator==(&local_30,local_48);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool is_key_exist(const K& key) {
        unique_lock<mutex> lck(hm_mutex);
        return hm_map.find(key) != hm_map.end();
    }